

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttbdf.c
# Opt level: O0

FT_Error tt_face_find_bdf_prop(TT_Face face,char *property_name,BDF_PropertyRec *aprop)

{
  FT_Byte *pFVar1;
  FT_Byte *pFVar2;
  FT_Size pFVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  void *pvVar9;
  FT_UInt32 value;
  FT_UInt32 name_offset;
  FT_UInt type;
  FT_UInt _count;
  FT_UInt _ppem;
  FT_Offset property_len;
  FT_Byte *strike;
  byte *pbStack_40;
  FT_UInt count;
  FT_Byte *p;
  FT_Error error;
  FT_Size size;
  TT_BDF bdf;
  BDF_PropertyRec *aprop_local;
  char *property_name_local;
  TT_Face face_local;
  
  pFVar3 = (face->root).size;
  aprop->type = BDF_PROPERTY_TYPE_NONE;
  if (((face->bdf).loaded != '\0') ||
     (p._4_4_ = tt_face_load_bdf_props(face,(face->root).stream), p._4_4_ == 0)) {
    strike._4_4_ = (face->bdf).num_strikes;
    pbStack_40 = (face->bdf).table + 8;
    property_len = (FT_Offset)(pbStack_40 + (strike._4_4_ << 2));
    p._4_4_ = 6;
    if ((pFVar3 != (FT_Size)0x0) &&
       ((property_name != (char *)0x0 && (sVar8 = strlen(property_name), sVar8 != 0)))) {
      for (; strike._4_4_ != 0; strike._4_4_ = strike._4_4_ - 1) {
        pFVar1 = pbStack_40 + 2;
        pFVar2 = pbStack_40 + 3;
        if (CONCAT11(*pbStack_40,pbStack_40[1]) == (pFVar3->metrics).y_ppem) {
          pbStack_40 = (byte *)property_len;
          strike._4_4_ = (uint)CONCAT11(*pFVar1,*pFVar2);
          do {
            if (strike._4_4_ == 0) {
              return 6;
            }
            bVar4 = pbStack_40[5];
            if ((bVar4 & 0x10) != 0) {
              uVar5 = (uint)*pbStack_40 << 0x18 | (uint)pbStack_40[1] << 0x10 |
                      (uint)pbStack_40[2] << 8 | (uint)pbStack_40[3];
              uVar6 = (uint)pbStack_40[6] << 0x18 | (uint)pbStack_40[7] << 0x10 |
                      (uint)pbStack_40[8] << 8 | (uint)pbStack_40[9];
              if ((((ulong)uVar5 < (face->bdf).strings_size) &&
                  (sVar8 < (face->bdf).strings_size - (ulong)uVar5)) &&
                 (iVar7 = strncmp(property_name,(char *)((face->bdf).strings + uVar5),
                                  (face->bdf).strings_size - (ulong)uVar5), iVar7 == 0)) {
                bVar4 = bVar4 & 0xf;
                if (bVar4 < 2) {
                  if (((ulong)uVar6 < (face->bdf).strings_size) &&
                     (pvVar9 = memchr((face->bdf).strings + uVar6,0,(face->bdf).strings_size),
                     pvVar9 != (void *)0x0)) {
                    aprop->type = BDF_PROPERTY_TYPE_ATOM;
                    (aprop->u).atom = (char *)((face->bdf).strings + uVar6);
                    return 0;
                  }
                }
                else {
                  if (bVar4 == 2) {
                    aprop->type = BDF_PROPERTY_TYPE_INTEGER;
                    (aprop->u).cardinal = uVar6;
                    return 0;
                  }
                  if (bVar4 == 3) {
                    aprop->type = BDF_PROPERTY_TYPE_CARDINAL;
                    (aprop->u).cardinal = uVar6;
                    return 0;
                  }
                }
              }
            }
            pbStack_40 = pbStack_40 + 10;
            strike._4_4_ = strike._4_4_ - 1;
          } while( true );
        }
        property_len = property_len + (uint)CONCAT11(*pFVar1,*pFVar2) * 10;
        pbStack_40 = pbStack_40 + 4;
      }
    }
  }
  return p._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_find_bdf_prop( TT_Face           face,
                         const char*       property_name,
                         BDF_PropertyRec  *aprop )
  {
    TT_BDF     bdf   = &face->bdf;
    FT_Size    size  = FT_FACE( face )->size;
    FT_Error   error = FT_Err_Ok;
    FT_Byte*   p;
    FT_UInt    count;
    FT_Byte*   strike;
    FT_Offset  property_len;


    aprop->type = BDF_PROPERTY_TYPE_NONE;

    if ( bdf->loaded == 0 )
    {
      error = tt_face_load_bdf_props( face, FT_FACE( face )->stream );
      if ( error )
        goto Exit;
    }

    count  = bdf->num_strikes;
    p      = bdf->table + 8;
    strike = p + 4 * count;

    error = FT_ERR( Invalid_Argument );

    if ( !size || !property_name )
      goto Exit;

    property_len = ft_strlen( property_name );
    if ( property_len == 0 )
      goto Exit;

    for ( ; count > 0; count-- )
    {
      FT_UInt  _ppem  = FT_NEXT_USHORT( p );
      FT_UInt  _count = FT_NEXT_USHORT( p );


      if ( _ppem == size->metrics.y_ppem )
      {
        count = _count;
        goto FoundStrike;
      }

      strike += 10 * _count;
    }
    goto Exit;

  FoundStrike:
    p = strike;
    for ( ; count > 0; count-- )
    {
      FT_UInt  type = FT_PEEK_USHORT( p + 4 );


      if ( ( type & 0x10 ) != 0 )
      {
        FT_UInt32  name_offset = FT_PEEK_ULONG( p     );
        FT_UInt32  value       = FT_PEEK_ULONG( p + 6 );

        /* be a bit paranoid for invalid entries here */
        if ( name_offset < bdf->strings_size                    &&
             property_len < bdf->strings_size - name_offset     &&
             ft_strncmp( property_name,
                         (const char*)bdf->strings + name_offset,
                         bdf->strings_size - name_offset ) == 0 )
        {
          switch ( type & 0x0F )
          {
          case 0x00:  /* string */
          case 0x01:  /* atoms */
            /* check that the content is really 0-terminated */
            if ( value < bdf->strings_size &&
                 ft_memchr( bdf->strings + value, 0, bdf->strings_size ) )
            {
              aprop->type   = BDF_PROPERTY_TYPE_ATOM;
              aprop->u.atom = (const char*)bdf->strings + value;
              error         = FT_Err_Ok;
              goto Exit;
            }
            break;

          case 0x02:
            aprop->type      = BDF_PROPERTY_TYPE_INTEGER;
            aprop->u.integer = (FT_Int32)value;
            error            = FT_Err_Ok;
            goto Exit;

          case 0x03:
            aprop->type       = BDF_PROPERTY_TYPE_CARDINAL;
            aprop->u.cardinal = value;
            error             = FT_Err_Ok;
            goto Exit;

          default:
            ;
          }
        }
      }
      p += 10;
    }

  Exit:
    return error;
  }